

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

int32_t tpl_get_satd_cost(BitDepthInfo bd_info,int16_t *src_diff,int diff_stride,uint8_t *src,
                         int src_stride,uint8_t *dst,int dst_stride,tran_low_t *coeff,int bw,int bh,
                         TX_SIZE tx_size)

{
  int iVar1;
  
  av1_subtract_block(bd_info,bh,bw,src_diff,(long)diff_stride,src,(long)src_stride,dst,
                     (long)dst_stride);
  av1_quick_txfm(0,tx_size,bd_info,src_diff,bw,coeff);
  iVar1 = (*aom_satd)(coeff,bh * bw);
  return iVar1;
}

Assistant:

static inline int32_t tpl_get_satd_cost(BitDepthInfo bd_info, int16_t *src_diff,
                                        int diff_stride, const uint8_t *src,
                                        int src_stride, const uint8_t *dst,
                                        int dst_stride, tran_low_t *coeff,
                                        int bw, int bh, TX_SIZE tx_size) {
  const int pix_num = bw * bh;

  av1_subtract_block(bd_info, bh, bw, src_diff, diff_stride, src, src_stride,
                     dst, dst_stride);
  av1_quick_txfm(/*use_hadamard=*/0, tx_size, bd_info, src_diff, bw, coeff);
  return aom_satd(coeff, pix_num);
}